

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int findreplaceengine(bstring b,bstring find,bstring repl,int pos,instr_fnptr instr)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  int iVar8;
  uchar *puVar9;
  long lVar10;
  int iVar11;
  size_t __n;
  long lVar12;
  undefined4 *puVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  int static_d [32];
  bstring local_f0;
  bstring local_e8;
  undefined4 local_b8 [34];
  
  bVar17 = 0;
  iVar11 = -1;
  if (b == (bstring)0x0) {
    return -1;
  }
  uVar16 = (ulong)(uint)pos;
  puVar5 = b->data;
  if (find == (bstring)0x0 || puVar5 == (uchar *)0x0) {
    return -1;
  }
  if (repl == (bstring)0x0 || find->data == (uchar *)0x0) {
    return -1;
  }
  puVar9 = repl->data;
  if (pos < 0 || puVar9 == (uchar *)0x0) {
    return -1;
  }
  iVar8 = find->slen;
  if (iVar8 < 1) {
    return -1;
  }
  uVar14 = b->mlen;
  if ((int)uVar14 < 0) {
    return -1;
  }
  uVar2 = b->slen;
  if (uVar14 < uVar2 || uVar14 == 0) {
    return -1;
  }
  iVar4 = repl->slen;
  if (iVar4 < 0) {
    return -1;
  }
  if (pos <= (int)(uVar2 - iVar8)) {
    lVar12 = (long)find->data - (long)puVar5;
    local_f0 = find;
    if (lVar12 < (long)(ulong)uVar2 && pos - iVar8 < lVar12) {
      local_f0 = bstrcpy(find);
      if (local_f0 == (bstring)0x0) {
        return -1;
      }
      puVar9 = repl->data;
      puVar5 = b->data;
      iVar4 = repl->slen;
    }
    local_e8 = repl;
    if (((long)(pos - iVar4) < (long)puVar9 - (long)puVar5) &&
       ((long)puVar9 - (long)puVar5 < (long)b->slen)) {
      local_e8 = bstrcpy(repl);
      if (local_e8 == (bstring)0x0) {
        if (local_f0 == find) {
          return -1;
        }
        goto LAB_00117578;
      }
      iVar4 = local_e8->slen;
    }
    uVar14 = local_f0->slen - iVar4;
    if (uVar14 == 0) {
      for (uVar14 = (*instr)(b,pos,local_f0); -1 < (int)uVar14;
          uVar14 = (*instr)(b,uVar14 + local_f0->slen,local_f0)) {
        memcpy(b->data + uVar14,local_e8->data,(long)local_e8->slen);
      }
    }
    else {
      if ((int)uVar14 < 1) {
        puVar6 = local_b8;
        iVar4 = 0x20;
        lVar12 = 1;
        iVar8 = 0;
        do {
          iVar3 = (*instr)(b,(int)uVar16,local_f0);
          puVar7 = puVar6;
          if (iVar3 < 0) {
            iVar11 = b->slen;
            puVar6[(int)lVar12 - 1] = iVar11;
            iVar4 = balloc(b,(iVar11 - iVar8) + 1);
            iVar11 = -1;
            if (iVar4 == 0) {
              iVar11 = b->slen - iVar8;
              b->slen = iVar11;
              if (lVar12 != 1) {
                lVar10 = (long)-iVar8;
                do {
                  lVar15 = (long)local_f0->slen + (long)(int)puVar6[(int)lVar12 - 2];
                  iVar11 = puVar6[lVar12 + -1] - (int)lVar15;
                  if (iVar11 != 0) {
                    memmove(b->data + lVar15 + lVar10,b->data + lVar15,(long)iVar11);
                  }
                  __n = (size_t)local_e8->slen;
                  if (__n != 0) {
                    memmove(b->data + lVar10 + (lVar15 - __n),local_e8->data,__n);
                  }
                  lVar10 = lVar10 + (int)uVar14;
                  lVar12 = lVar12 + -1;
                } while (1 < lVar12);
                iVar11 = b->slen;
              }
              b->data[iVar11] = '\0';
              iVar11 = 0;
            }
            goto LAB_0011754c;
          }
          if (iVar4 <= (int)lVar12) {
            iVar1 = iVar4 * 2;
            puVar7 = (undefined4 *)0x0;
            if (local_b8 != puVar6) {
              puVar7 = puVar6;
            }
            iVar11 = -1;
            if ((SBORROW4(iVar4 * 0x10,iVar1) != iVar4 * 0xe < 0) ||
               (puVar6 = (undefined4 *)realloc(puVar7,(long)(iVar4 * 0x10)),
               puVar6 == (undefined4 *)0x0)) goto LAB_0011754c;
            iVar4 = iVar1;
            if (puVar7 == (undefined4 *)0x0) {
              puVar7 = local_b8;
              puVar13 = puVar6;
              for (lVar10 = 0x20; lVar10 != 0; lVar10 = lVar10 + -1) {
                *puVar13 = *puVar7;
                puVar7 = puVar7 + (ulong)bVar17 * -2 + 1;
                puVar13 = puVar13 + (ulong)bVar17 * -2 + 1;
              }
            }
          }
          puVar6[lVar12 + -1] = iVar3;
          lVar12 = lVar12 + 1;
          iVar8 = iVar8 + uVar14;
          uVar2 = iVar3 + local_f0->slen;
          uVar16 = (ulong)uVar2;
        } while (-1 < (int)uVar2);
        iVar11 = -1;
        puVar7 = puVar6;
LAB_0011754c:
        puVar6 = (undefined4 *)0x0;
        if (local_b8 != puVar7) {
          puVar6 = puVar7;
        }
        free(puVar6);
        if (local_f0 != find) {
          bdestroy(local_f0);
        }
        local_f0 = local_e8;
        if (local_e8 == repl) {
          return iVar11;
        }
LAB_00117578:
        bdestroy(local_f0);
        return iVar11;
      }
      uVar2 = (*instr)(b,pos,local_f0);
      if (-1 < (int)uVar2) {
        iVar11 = 0;
        lVar12 = 0;
        do {
          if (lVar12 != 0) {
            iVar8 = (int)uVar16;
            if (uVar2 - iVar8 != 0 && iVar8 <= (int)uVar2) {
              memmove(b->data + iVar8 + lVar12,b->data + iVar8,(long)(int)(uVar2 - iVar8));
            }
          }
          if ((long)local_e8->slen != 0) {
            memcpy(b->data + lVar12 + (ulong)uVar2,local_e8->data,(long)local_e8->slen);
          }
          uVar16 = (long)(int)uVar2 + (long)local_f0->slen;
          iVar8 = (int)uVar16;
          uVar2 = (*instr)(b,iVar8,local_f0);
          lVar12 = lVar12 - (ulong)uVar14;
          iVar11 = iVar11 + uVar14;
        } while (-1 < (int)uVar2);
        iVar4 = b->slen;
        if (iVar4 - iVar8 != 0 && iVar8 <= iVar4) {
          memmove(b->data + uVar16 + -(-lVar12 & 0xffffffffU),b->data + uVar16,(long)(iVar4 - iVar8)
                 );
          iVar4 = b->slen;
        }
        b->slen = iVar4 - iVar11;
        b->data[iVar4 - iVar11] = '\0';
      }
    }
    if (local_f0 != find) {
      bdestroy(local_f0);
    }
    if (local_e8 != repl) {
      bdestroy(local_e8);
    }
  }
  return 0;
}

Assistant:

static int findreplaceengine (bstring b, const bstring find, const bstring repl, int pos, instr_fnptr instr) {
int i, ret, slen, mlen, delta, acc;
int * d;
int static_d[32];
ptrdiff_t pd;
bstring auxf = find;
bstring auxr = repl;

	if (b == NULL || b->data == NULL || find == NULL ||
	    find->data == NULL || repl == NULL || repl->data == NULL || 
	    pos < 0 || find->slen <= 0 || b->mlen < 0 || b->slen > b->mlen || 
	    b->mlen <= 0 || b->slen < 0 || repl->slen < 0) return BSTR_ERR;
	if (pos > b->slen - find->slen) return 0;

	/* Alias with find string */
	pd = (ptrdiff_t) (find->data - b->data);
	if ((ptrdiff_t) (pos - find->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxf = bstrcpy (find))) return BSTR_ERR;
	}

	/* Alias with repl string */
	pd = (ptrdiff_t) (repl->data - b->data);
	if ((ptrdiff_t) (pos - repl->slen) < pd && pd < (ptrdiff_t) b->slen) {
		if (NULL == (auxr = bstrcpy (repl))) {
			if (auxf != find) bdestroy (auxf);
			return BSTR_ERR;
		}
	}

	delta = auxf->slen - auxr->slen;

	/* in-place replacement since find and replace strings are of equal 
	   length */
	if (delta == 0) {
		while ((pos = instr (b, pos, auxf)) >= 0) {
			bstr__memcpy (b->data + pos, auxr->data, auxr->slen);
			pos += auxf->slen;
		}
		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return 0;
	}

	/* shrinking replacement since auxf->slen > auxr->slen */
	if (delta > 0) {
		acc = 0;

		while ((i = instr (b, pos, auxf)) >= 0) {
			if (acc && i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			if (auxr->slen)
				bstr__memcpy (b->data + i - acc, auxr->data, auxr->slen);
			acc += delta;
			pos = i + auxf->slen;
		}

		if (acc) {
			i = b->slen;
			if (i > pos)
				bstr__memmove (b->data + pos - acc, b->data + pos, i - pos);
			b->slen -= acc;
			b->data[b->slen] = (unsigned char) '\0';
		}

		if (auxf != find) bdestroy (auxf);
		if (auxr != repl) bdestroy (auxr);
		return 0;
	}

	/* expanding replacement since find->slen < repl->slen.  Its a lot 
	   more complicated. */

	mlen = 32;
	d = (int *) static_d; /* Avoid malloc for trivial cases */
	acc = slen = 0;

	while ((pos = instr (b, pos, auxf)) >= 0) {
		if (slen + 1 >= mlen) {
			int sl;
			int * t;
			mlen += mlen;
			sl = sizeof (int *) * mlen;
			if (static_d == d) d = NULL;
			if (sl < mlen || NULL == (t = (int *) bstr__realloc (d, sl))) {
				ret = BSTR_ERR;
				goto done;
			}
			if (NULL == d) bstr__memcpy (t, static_d, sizeof (static_d));
			d = t;
		}
		d[slen] = pos;
		slen++;
		acc -= delta;
		pos += auxf->slen;
		if (pos < 0 || acc < 0) {
			ret = BSTR_ERR;
			goto done;
		}
	}
	d[slen] = b->slen;

	if (BSTR_OK == (ret = balloc (b, b->slen + acc + 1))) {
		b->slen += acc;
		for (i = slen-1; i >= 0; i--) {
			int s, l;
			s = d[i] + auxf->slen;
			l = d[i+1] - s;
			if (l) {
				bstr__memmove (b->data + s + acc, b->data + s, l);
			}
			if (auxr->slen) {
				bstr__memmove (b->data + s + acc - auxr->slen, 
				         auxr->data, auxr->slen);
			}
			acc += delta;		
		}
		b->data[b->slen] = (unsigned char) '\0';
	}

	done:;
	if (static_d == d) d = NULL;
	bstr__free (d);
	if (auxf != find) bdestroy (auxf);
	if (auxr != repl) bdestroy (auxr);
	return ret;
}